

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

size_t __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
add_before(SignalLink *this,CbFunction *cb)

{
  SignalLink *this_00;
  SignalLink *in_RDI;
  SignalLink *link;
  
  this_00 = (SignalLink *)operator_new(0x38);
  SignalLink(this_00,(CbFunction *)in_RDI);
  this_00->prev = in_RDI->prev;
  this_00->next = in_RDI;
  in_RDI->prev->next = this_00;
  in_RDI->prev = this_00;
  return (size_t)this_00;
}

Assistant:

size_t add_before(const CbFunction &cb) {
      SignalLink *link = new SignalLink(cb);
      link->prev = prev;  // link to last
      link->next = this;
      prev->next = link;  // link from last
      prev = link;
      static_assert(sizeof(link) == sizeof(size_t), "sizeof size_t");
      return size_t(link);
    }